

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::(anonymous_namespace)::valueToString_abi_cxx11_
                   (double value,bool useSpecialFloats,uint precision)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint in_EDX;
  char *pcVar4;
  byte in_SIL;
  string *in_RDI;
  double in_XMM0_Qa;
  char formatString [15];
  int len;
  char buffer [36];
  allocator<char> local_5c;
  char local_5b [11];
  undefined4 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  bVar1 = in_SIL & 1;
  snprintf(local_5b,0xf,"%%.%dg",(ulong)in_EDX);
  bVar2 = std::isfinite(in_XMM0_Qa);
  if (bVar2) {
    iVar3 = snprintf(&stack0xffffffffffffffb8,0x24,local_5b,in_XMM0_Qa);
    fixNumericLocale(&stack0xffffffffffffffb8,&stack0xffffffffffffffb8 + iVar3);
    pcVar4 = strchr(&stack0xffffffffffffffb8,0x2e);
    if ((pcVar4 == (char *)0x0) &&
       (pcVar4 = strchr(&stack0xffffffffffffffb8,0x65), pcVar4 == (char *)0x0)) {
      strcat(&stack0xffffffffffffffb8,".0");
    }
  }
  else if (NAN(in_XMM0_Qa)) {
    pcVar4 = "null";
    if (bVar1 != 0) {
      pcVar4 = "NaN";
    }
    iVar3 = snprintf(&stack0xffffffffffffffb8,0x24,pcVar4);
  }
  else if (0.0 <= in_XMM0_Qa) {
    pcVar4 = "-1e+9999";
    if (bVar1 != 0) {
      pcVar4 = "-Infinity";
    }
    iVar3 = snprintf(&stack0xffffffffffffffb8,0x24,pcVar4 + 1);
  }
  else {
    pcVar4 = "-1e+9999";
    if (bVar1 != 0) {
      pcVar4 = "-Infinity";
    }
    iVar3 = snprintf(&stack0xffffffffffffffb8,0x24,pcVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  std::allocator<char>::~allocator(&local_5c);
  return in_RDI;
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[15];
  snprintf(formatString, sizeof(formatString), "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    fixNumericLocale(buffer, buffer + len);

    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strchr(buffer, '.') && !strchr(buffer, 'e')) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
  }
  assert(len >= 0);
  return buffer;
}